

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatPath.cpp
# Opt level: O2

string * __thiscall FatPath::getBasename_abi_cxx11_(string *__return_storage_ptr__,FatPath *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             ((this->parts).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1));
  return __return_storage_ptr__;
}

Assistant:

string FatPath::getBasename()
{
    return parts[parts.size()-1];
}